

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_allocator.cpp
# Opt level: O2

void * nodecpp::VirtualMemory::AllocateAddressSpace(size_t size)

{
  int __errnum;
  void *pvVar1;
  int *piVar2;
  char *obj_2;
  undefined8 *puVar3;
  ModuleID local_20;
  
  pvVar1 = mmap((void *)0x0,size,0,0x22,-1,0);
  if (pvVar1 != (void *)0xffffffffffffffff) {
    return pvVar1;
  }
  piVar2 = __errno_location();
  __errnum = *piVar2;
  local_20.str = "foundation";
  obj_2 = strerror(__errnum);
  log::default_log::error<char_const*,unsigned_long,int,char*>
            (&local_20,"mmap error at AllocateAddressSpace({}), error = {} ({})",size,__errnum,obj_2
            );
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = clock_gettime;
  __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

void* VirtualMemory::AllocateAddressSpace(size_t size)
{
    void * ptr = mmap((void*)0, size, PROT_NONE, MAP_PRIVATE|MAP_ANON, -1, 0);
	if (ptr == (void*)(-1))
	{
		int e = errno;
		nodecpp::log::default_log::error( nodecpp::log::ModuleID(nodecpp::foundation_module_id), "mmap error at AllocateAddressSpace({}), error = {} ({})", size, e, strerror(e) );
		throw std::bad_alloc();
	}
 //   msync(ptr, size, MS_SYNC|MS_INVALIDATE);
    return ptr;
}